

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  Options *pOVar4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_110;
  string_view local_108;
  string_view local_f8;
  string_view local_e8;
  Options local_d8;
  string_view local_88 [2];
  Options local_68;
  Printer *local_18;
  Printer *printer_local;
  ImmutablePrimitiveFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar3 = FieldDescriptor::has_presence(this->descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    pFVar1 = this->descriptor_;
    pOVar4 = Context::options(this->context_);
    java::Options::Options(&local_68,pOVar4);
    WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_68,false,false,false);
    java::Options::~Options(&local_68);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_88,"$deprecation$boolean has$capitalized_name$();\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_88[0]);
  }
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options(&local_d8,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_d8,false,false,false);
  java::Options::~Options(&local_d8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e8,"$deprecation$$type$ ${$get$capitalized_name$$}$();\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_e8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_110);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_f8,local_108,pFVar1,local_110);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                                 context_->options());
    printer->Print(variables_,
                   "$deprecation$boolean has$capitalized_name$();\n");
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$$type$ ${$get$capitalized_name$$}$();\n");
  printer->Annotate("{", "}", descriptor_);
}